

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanSyncObjectManager.hpp
# Opt level: O0

void __thiscall
VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkFenceType>::Release
          (RecycledSyncObject<VulkanUtilities::VkFenceType> *this)

{
  bool bVar1;
  element_type *this_00;
  RecycledSyncObject<VulkanUtilities::VkFenceType> *this_local;
  
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)this);
  if ((bVar1) && (this->m_VkSyncObject != (NativeType)0x0)) {
    this_00 = std::
              __shared_ptr_access<VulkanUtilities::VulkanSyncObjectManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<VulkanUtilities::VulkanSyncObjectManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)this);
    Recycle(this_00,this->m_VkSyncObject,(bool)(this->m_IsUnsignaled & 1));
    this->m_VkSyncObject = (NativeType)0x0;
    std::__shared_ptr<VulkanUtilities::VulkanSyncObjectManager,_(__gnu_cxx::_Lock_policy)2>::reset
              ((__shared_ptr<VulkanUtilities::VulkanSyncObjectManager,_(__gnu_cxx::_Lock_policy)2> *
               )this);
  }
  return;
}

Assistant:

void Release()
    {
        if (m_pManager && m_VkSyncObject != VK_NULL_HANDLE)
        {
            m_pManager->Recycle(VkSyncObjType{m_VkSyncObject}, m_IsUnsignaled);
            m_VkSyncObject = VK_NULL_HANDLE;
            m_pManager.reset();
        }
    }